

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall DialogPrompt::DialogPrompt(DialogPrompt *this)

{
  undefined8 *in_RDI;
  value_type *__x;
  vector<DialogPrompt_*,_std::allocator<DialogPrompt_*>_> *this_00;
  Vector2f *in_stack_ffffffffffffffb8;
  UIComponent *in_stack_ffffffffffffffc0;
  RectangleShape *this_01;
  Vector2<float> local_1c [3];
  
  UIComponent::UIComponent(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__DialogPrompt_002bc2c0;
  in_RDI[1] = &DAT_002bc2f8;
  sf::Text::Text((Text *)(in_RDI + 0x17));
  this_01 = (RectangleShape *)(in_RDI + 0x45);
  sf::Vector2<float>::Vector2(local_1c,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_01,in_stack_ffffffffffffffb8);
  __x = (value_type *)(in_RDI + 0x70);
  std::vector<TextButton,_std::allocator<TextButton>_>::vector
            ((vector<TextButton,_std::allocator<TextButton>_> *)0x1aa38d);
  this_00 = (vector<DialogPrompt_*,_std::allocator<DialogPrompt_*>_> *)(in_RDI + 0x73);
  std::vector<TextField,_std::allocator<TextField>_>::vector
            ((vector<TextField,_std::allocator<TextField>_> *)0x1aa3a3);
  std::vector<CheckBox,_std::allocator<CheckBox>_>::vector
            ((vector<CheckBox,_std::allocator<CheckBox>_> *)0x1aa3b9);
  std::vector<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>::push_back(this_00,__x);
  return;
}

Assistant:

DialogPrompt::DialogPrompt() {
    UserInterface::_dialogPrompts.push_back(this);
}